

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[28],char_const*,char[28],char_const*,char[34]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [28],char **Args_1,
          char (*Args_2) [28],char **Args_3,char (*Args_4) [34])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [34];
  char **Args_local_3;
  char (*Args_local_2) [28];
  char **Args_local_1;
  char (*Args_local) [28];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[28],char_const*,char[28],char_const*,char[34]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [28])this,(char **)Args,(char (*) [28])Args_1,(char **)Args_2,
             (char (*) [34])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}